

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O0

size_t crnlib::crnlib_msize(void *p)

{
  ulong in_RDI;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = 0;
  }
  else if ((in_RDI & 0xf) == 0) {
    local_8 = (*(code *)g_pMSize)(in_RDI,g_pUser_data);
  }
  else {
    crnlib_mem_error((char *)0x152717);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t crnlib_msize(void* p) {
  if (!p)
    return 0;

  if (reinterpret_cast<ptr_bits_t>(p) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) {
    crnlib_mem_error("crnlib_msize: bad ptr");
    return 0;
  }

  return (*g_pMSize)(p, g_pUser_data);
}